

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.hpp
# Opt level: O0

string_type * __thiscall
toml::detail::serializer<toml::type_config>::operator()[abi_cxx11_
          (serializer<toml::type_config> *this,array_type *a,array_format_info *fmt,
          comment_type *com,source_location *loc)

{
  bool bVar1;
  integer_type *piVar2;
  string_format_info *psVar3;
  size_type sVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  table_format_info *ptVar5;
  reference this_01;
  char *in_RCX;
  undefined8 in_RDX;
  long in_RSI;
  serializer<toml::type_config> *in_RDI;
  source_location *in_stack_000000e0;
  integer_format_info *in_stack_000000e8;
  integer_type in_stack_000000f0;
  serializer<toml::type_config> *in_stack_000000f8;
  value_type *in_stack_00000110;
  serializer<toml::type_config> *in_stack_00000118;
  basic_value<toml::type_config> *e_3;
  const_iterator __end0_3;
  const_iterator __begin0_3;
  array_type *__range5_2;
  basic_value<toml::type_config> *e_2;
  const_iterator __end0_2;
  const_iterator __begin0_2;
  array_type *__range5_1;
  basic_value<toml::type_config> *e_1;
  const_iterator __end0_1;
  const_iterator __begin0_1;
  array_type *__range4;
  basic_value<toml::type_config> *e;
  const_iterator __end0;
  const_iterator __begin0;
  array_type *__range5;
  size_t approx_len;
  array_format f;
  string_type *retval;
  undefined7 in_stack_fffffffffffff958;
  char in_stack_fffffffffffff95f;
  source_location *in_stack_fffffffffffff960;
  boolean_format_info *in_stack_fffffffffffff968;
  source_location *in_stack_fffffffffffff970;
  source_location *in_stack_fffffffffffff978;
  serialization_error *in_stack_fffffffffffff980;
  allocator<char> *in_stack_fffffffffffff990;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff998;
  basic_value<toml::type_config> *in_stack_fffffffffffff9a0;
  integer_type in_stack_fffffffffffff9d0;
  integer_format_info *in_stack_fffffffffffff9d8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffff9e0;
  serializer<toml::type_config> *in_stack_fffffffffffff9e8;
  undefined1 *in_stack_fffffffffffff9f8;
  serializer<toml::type_config> *this_02;
  __normal_iterator<const_toml::basic_value<toml::type_config>_*,_std::vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>_>
  in_stack_fffffffffffffac8;
  table_type *in_stack_fffffffffffffad0;
  serializer<toml::type_config> *in_stack_fffffffffffffad8;
  __normal_iterator<const_toml::basic_value<toml::type_config>_*,_std::vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>_>
  local_4b0;
  undefined8 local_4a8;
  undefined1 local_499;
  basic_value<toml::type_config> *local_3d0;
  basic_value<toml::type_config> *local_3c8;
  __normal_iterator<const_toml::basic_value<toml::type_config>_*,_std::vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>_>
  local_3c0;
  undefined8 local_3b8;
  undefined1 local_3aa;
  undefined1 local_3a9;
  source_location *in_stack_fffffffffffffcb0;
  floating_format_info *in_stack_fffffffffffffcb8;
  floating_type in_stack_fffffffffffffcc0;
  serializer<toml::type_config> *in_stack_fffffffffffffcc8;
  _Alloc_hider in_stack_fffffffffffffd90;
  string_format_info *in_stack_fffffffffffffd98;
  undefined8 in_stack_fffffffffffffda0;
  undefined8 in_stack_fffffffffffffda8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1b8 [5];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  undefined1 local_110 [120];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  reference local_78;
  basic_value<toml::type_config> *local_70;
  __normal_iterator<const_toml::basic_value<toml::type_config>_*,_std::vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>_>
  local_68;
  undefined8 local_60;
  ulong local_58;
  basic_value<toml::type_config> *local_48;
  basic_value<toml::type_config> *local_40;
  char local_31;
  char *local_20;
  undefined8 local_18;
  
  local_31 = *in_RCX;
  this_02 = in_RDI;
  local_20 = in_RCX;
  local_18 = in_RDX;
  if (*in_RCX == '\0') {
    bVar1 = CLI::std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_fffffffffffff970);
    if (((!bVar1) &&
        (bVar1 = std::
                 vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
                 ::empty((vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
                          *)in_stack_fffffffffffff970), !bVar1)) &&
       (bVar1 = preserve_comments::empty((preserve_comments *)0x6921af), bVar1)) {
      local_40 = (basic_value<toml::type_config> *)
                 std::
                 vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
                 ::begin((vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
                          *)CONCAT17(in_stack_fffffffffffff95f,in_stack_fffffffffffff958));
      local_48 = (basic_value<toml::type_config> *)
                 std::
                 vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
                 ::end((vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
                        *)CONCAT17(in_stack_fffffffffffff95f,in_stack_fffffffffffff958));
      bVar1 = std::
              all_of<__gnu_cxx::__normal_iterator<toml::basic_value<toml::type_config>const*,std::vector<toml::basic_value<toml::type_config>,std::allocator<toml::basic_value<toml::type_config>>>>,toml::detail::serializer<toml::type_config>::operator()[abi:cxx11](std::vector<toml::basic_value<toml::type_config>,std::allocator<toml::basic_value<toml::type_config>>>const&,toml::array_format_info_const&,toml::preserve_comments_const&,toml::source_location_const&)::_lambda(toml::basic_value<toml::type_config>const&)_1_>
                        (local_40,local_48);
      if (bVar1) {
        local_31 = '\x03';
        goto LAB_006927aa;
      }
    }
    local_31 = '\x01';
    local_58 = 0;
    local_60 = local_18;
    local_68._M_current =
         (basic_value<toml::type_config> *)
         std::
         vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
         ::begin((vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
                  *)CONCAT17(in_stack_fffffffffffff95f,in_stack_fffffffffffff958));
    local_70 = (basic_value<toml::type_config> *)
               std::
               vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
               ::end((vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
                      *)CONCAT17(in_stack_fffffffffffff95f,in_stack_fffffffffffff958));
    while (bVar1 = __gnu_cxx::
                   operator==<const_toml::basic_value<toml::type_config>_*,_std::vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>_>
                             ((__normal_iterator<const_toml::basic_value<toml::type_config>_*,_std::vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>_>
                               *)in_stack_fffffffffffff960,
                              (__normal_iterator<const_toml::basic_value<toml::type_config>_*,_std::vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>_>
                               *)CONCAT17(in_stack_fffffffffffff95f,in_stack_fffffffffffff958)),
          ((bVar1 ^ 0xffU) & 1) != 0) {
      local_78 = __gnu_cxx::
                 __normal_iterator<const_toml::basic_value<toml::type_config>_*,_std::vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>_>
                 ::operator*(&local_68);
      basic_value<toml::type_config>::comments(local_78);
      bVar1 = preserve_comments::empty((preserve_comments *)0x69229f);
      if (!bVar1) {
        local_31 = '\x02';
        break;
      }
      bVar1 = basic_value<toml::type_config>::is_array((basic_value<toml::type_config> *)0x6922bd);
      if (((bVar1) ||
          (bVar1 = basic_value<toml::type_config>::is_table
                             ((basic_value<toml::type_config> *)0x6922ce), bVar1)) ||
         ((bVar1 = basic_value<toml::type_config>::is_offset_datetime
                             ((basic_value<toml::type_config> *)0x6922df), bVar1 ||
          (bVar1 = basic_value<toml::type_config>::is_local_datetime
                             ((basic_value<toml::type_config> *)0x6922f0), bVar1)))) {
        local_31 = '\x02';
        break;
      }
      bVar1 = basic_value<toml::type_config>::is_boolean((basic_value<toml::type_config> *)0x692310)
      ;
      if (bVar1) {
        in_stack_fffffffffffff9e8 =
             (serializer<toml::type_config> *)
             basic_value<toml::type_config>::as_boolean(in_stack_fffffffffffff9a0);
        basic_value<toml::type_config>::as_boolean_fmt(in_stack_fffffffffffff9a0);
        in_stack_fffffffffffff9f8 = local_110;
        basic_value<toml::type_config>::location
                  ((basic_value<toml::type_config> *)
                   CONCAT17(in_stack_fffffffffffff95f,in_stack_fffffffffffff958));
        operator()[abi_cxx11_
                  ((serializer<toml::type_config> *)in_stack_fffffffffffff978,
                   &in_stack_fffffffffffff970->is_ok_,in_stack_fffffffffffff968,
                   in_stack_fffffffffffff960);
        sVar4 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                ::size(&local_98);
        local_58 = sVar4 + local_58;
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff960);
        source_location::~source_location(in_stack_fffffffffffff960);
      }
      else {
        bVar1 = basic_value<toml::type_config>::is_integer
                          ((basic_value<toml::type_config> *)0x6923fe);
        if (bVar1) {
          piVar2 = basic_value<toml::type_config>::as_integer(in_stack_fffffffffffff9a0);
          in_stack_fffffffffffff9d0 = *piVar2;
          in_stack_fffffffffffff9d8 =
               basic_value<toml::type_config>::as_integer_fmt(in_stack_fffffffffffff9a0);
          in_stack_fffffffffffff9e0 = local_1b8;
          basic_value<toml::type_config>::location
                    ((basic_value<toml::type_config> *)
                     CONCAT17(in_stack_fffffffffffff95f,in_stack_fffffffffffff958));
          operator()[abi_cxx11_
                    (in_stack_000000f8,in_stack_000000f0,in_stack_000000e8,in_stack_000000e0);
          sVar4 = CLI::std::__cxx11::
                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                            (&local_140);
          local_58 = sVar4 + local_58;
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff960);
          source_location::~source_location(in_stack_fffffffffffff960);
        }
        else {
          bVar1 = basic_value<toml::type_config>::is_floating
                            ((basic_value<toml::type_config> *)0x6924e9);
          if (bVar1) {
            basic_value<toml::type_config>::as_floating(in_stack_fffffffffffff9a0);
            basic_value<toml::type_config>::as_floating_fmt(in_stack_fffffffffffff9a0);
            basic_value<toml::type_config>::location
                      ((basic_value<toml::type_config> *)
                       CONCAT17(in_stack_fffffffffffff95f,in_stack_fffffffffffff958));
            operator()[abi_cxx11_
                      (in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8
                       ,in_stack_fffffffffffffcb0);
            sVar4 = CLI::std::__cxx11::
                    basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                              (&local_1d8);
            local_58 = sVar4 + local_58;
            std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffff960);
            source_location::~source_location(in_stack_fffffffffffff960);
          }
          else {
            bVar1 = basic_value<toml::type_config>::is_string
                              ((basic_value<toml::type_config> *)0x6925cb);
            if (bVar1) {
              psVar3 = basic_value<toml::type_config>::as_string_fmt(in_stack_fffffffffffff9a0);
              if ((psVar3->fmt == multiline_basic) ||
                 (psVar3 = basic_value<toml::type_config>::as_string_fmt(in_stack_fffffffffffff9a0),
                 psVar3->fmt == multiline_literal)) {
                local_31 = '\x02';
                break;
              }
              basic_value<toml::type_config>::as_string_abi_cxx11_(in_stack_fffffffffffff9a0);
              std::__cxx11::string::string
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_fffffffffffff9a0,in_stack_fffffffffffff998);
              basic_value<toml::type_config>::as_string_fmt(in_stack_fffffffffffff9a0);
              basic_value<toml::type_config>::location
                        ((basic_value<toml::type_config> *)
                         CONCAT17(in_stack_fffffffffffff95f,in_stack_fffffffffffff958));
              operator()((serializer<toml::type_config> *)in_stack_fffffffffffffda8,
                         (string_type *)in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,
                         (source_location *)in_stack_fffffffffffffd90._M_p);
              sVar4 = CLI::std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&stack0xfffffffffffffd90);
              local_58 = sVar4 + 2 + local_58;
              std::__cxx11::string::~string
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_fffffffffffff960);
              source_location::~source_location(in_stack_fffffffffffff960);
              std::__cxx11::string::~string
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_fffffffffffff960);
            }
            else {
              bVar1 = basic_value<toml::type_config>::is_local_date
                                ((basic_value<toml::type_config> *)0x69271c);
              if (bVar1) {
                local_58 = local_58 + 10;
              }
              else {
                bVar1 = basic_value<toml::type_config>::is_local_time
                                  ((basic_value<toml::type_config> *)0x692745);
                if (bVar1) {
                  local_58 = local_58 + 0xf;
                }
              }
            }
          }
        }
      }
      if (0x3c < local_58) {
        local_31 = '\x02';
        break;
      }
      local_58 = local_58 + 2;
      __gnu_cxx::
      __normal_iterator<const_toml::basic_value<toml::type_config>_*,_std::vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>_>
      ::operator++(&local_68);
    }
  }
LAB_006927aa:
  if (((*(byte *)(in_RSI + 0x18) & 1) != 0) && (local_31 == '\x03')) {
    local_31 = '\x02';
  }
  bVar1 = std::
          vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
          ::empty((vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
                   *)in_stack_fffffffffffff970);
  if ((bVar1) && (local_31 == '\x03')) {
    local_31 = '\x01';
  }
  if (local_31 == '\x03') {
    bVar1 = CLI::std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_fffffffffffff970);
    if (bVar1) {
      local_3a9 = 1;
      this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                __cxa_allocate_exception(0xa0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (this_00,(char *)in_stack_fffffffffffff998,in_stack_fffffffffffff990);
      source_location::source_location
                ((source_location *)in_stack_fffffffffffff980,in_stack_fffffffffffff978);
      serialization_error::serialization_error
                (in_stack_fffffffffffff980,(string *)in_stack_fffffffffffff978,
                 in_stack_fffffffffffff970);
      local_3a9 = 0;
      __cxa_throw(this_00,&serialization_error::typeinfo,serialization_error::~serialization_error);
    }
    local_3aa = 0;
    std::__cxx11::string::string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff970);
    local_3b8 = local_18;
    local_3c0._M_current =
         (basic_value<toml::type_config> *)
         std::
         vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
         ::begin((vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
                  *)CONCAT17(in_stack_fffffffffffff95f,in_stack_fffffffffffff958));
    local_3c8 = (basic_value<toml::type_config> *)
                std::
                vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
                ::end((vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
                       *)CONCAT17(in_stack_fffffffffffff95f,in_stack_fffffffffffff958));
    while (bVar1 = __gnu_cxx::
                   operator==<const_toml::basic_value<toml::type_config>_*,_std::vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>_>
                             ((__normal_iterator<const_toml::basic_value<toml::type_config>_*,_std::vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>_>
                               *)in_stack_fffffffffffff960,
                              (__normal_iterator<const_toml::basic_value<toml::type_config>_*,_std::vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>_>
                               *)CONCAT17(in_stack_fffffffffffff95f,in_stack_fffffffffffff958)),
          ((bVar1 ^ 0xffU) & 1) != 0) {
      local_3d0 = __gnu_cxx::
                  __normal_iterator<const_toml::basic_value<toml::type_config>_*,_std::vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>_>
                  ::operator*(&local_3c0);
      ptVar5 = basic_value<toml::type_config>::as_table_fmt(in_stack_fffffffffffff9a0);
      *(int *)(in_RSI + 0x1c) = *(int *)(in_RSI + 0x1c) + ptVar5->name_indent;
      basic_value<toml::type_config>::comments(local_3d0);
      basic_value<toml::type_config>::as_table_fmt(in_stack_fffffffffffff9a0);
      format_comments_abi_cxx11_
                (this_02,(preserve_comments *)in_RDI,
                 (indent_char)((ulong)in_stack_fffffffffffff9f8 >> 0x38));
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      operator+=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff960,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffff95f,in_stack_fffffffffffff958));
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff960);
      basic_value<toml::type_config>::as_table_fmt(in_stack_fffffffffffff9a0);
      format_indent_abi_cxx11_
                ((serializer<toml::type_config> *)in_stack_fffffffffffff9d8,
                 (indent_char)((ulong)in_stack_fffffffffffff9d0 >> 0x38));
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      operator+=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff960,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffff95f,in_stack_fffffffffffff958));
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff960);
      ptVar5 = basic_value<toml::type_config>::as_table_fmt(in_stack_fffffffffffff9a0);
      *(int *)(in_RSI + 0x1c) = *(int *)(in_RSI + 0x1c) - ptVar5->name_indent;
      string_conv<std::__cxx11::string,3ul>
                ((char (*) [3])CONCAT17(in_stack_fffffffffffff95f,in_stack_fffffffffffff958));
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      operator+=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff960,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffff95f,in_stack_fffffffffffff958));
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff960);
      format_keys(in_stack_fffffffffffff9e8,in_stack_fffffffffffff9e0);
      std::
      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      value((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)in_stack_fffffffffffff960);
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      operator+=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff960,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffff95f,in_stack_fffffffffffff958));
      std::
      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~optional((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)0x692b65);
      string_conv<std::__cxx11::string,4ul>
                ((char (*) [4])CONCAT17(in_stack_fffffffffffff95f,in_stack_fffffffffffff958));
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      operator+=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff960,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffff95f,in_stack_fffffffffffff958));
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff960);
      basic_value<toml::type_config>::as_table_abi_cxx11_(in_stack_fffffffffffff9a0);
      in_stack_fffffffffffff960 =
           (source_location *)
           basic_value<toml::type_config>::as_table_fmt(in_stack_fffffffffffff9a0);
      format_ml_table(in_stack_fffffffffffffad8,in_stack_fffffffffffffad0,
                      (table_format_info *)in_stack_fffffffffffffac8._M_current);
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      operator+=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff960,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffff95f,in_stack_fffffffffffff958));
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff960);
      __gnu_cxx::
      __normal_iterator<const_toml::basic_value<toml::type_config>_*,_std::vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>_>
      ::operator++(&local_3c0);
    }
  }
  else if (local_31 == '\x01') {
    local_499 = 0;
    std::__cxx11::string::string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff970);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff960,in_stack_fffffffffffff95f);
    local_4a8 = local_18;
    local_4b0._M_current =
         (basic_value<toml::type_config> *)
         std::
         vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
         ::begin((vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
                  *)CONCAT17(in_stack_fffffffffffff95f,in_stack_fffffffffffff958));
    std::
    vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
    ::end((vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
           *)CONCAT17(in_stack_fffffffffffff95f,in_stack_fffffffffffff958));
    while (bVar1 = __gnu_cxx::
                   operator==<const_toml::basic_value<toml::type_config>_*,_std::vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>_>
                             ((__normal_iterator<const_toml::basic_value<toml::type_config>_*,_std::vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>_>
                               *)in_stack_fffffffffffff960,
                              (__normal_iterator<const_toml::basic_value<toml::type_config>_*,_std::vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>_>
                               *)CONCAT17(in_stack_fffffffffffff95f,in_stack_fffffffffffff958)),
          ((bVar1 ^ 0xffU) & 1) != 0) {
      __gnu_cxx::
      __normal_iterator<const_toml::basic_value<toml::type_config>_*,_std::vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>_>
      ::operator*(&local_4b0);
      *(undefined1 *)(in_RSI + 0x18) = 1;
      operator()[abi_cxx11_(in_stack_00000118,in_stack_00000110);
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      operator+=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff960,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffff95f,in_stack_fffffffffffff958));
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff960);
      string_conv<std::__cxx11::string,3ul>
                ((char (*) [3])CONCAT17(in_stack_fffffffffffff95f,in_stack_fffffffffffff958));
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      operator+=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff960,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffff95f,in_stack_fffffffffffff958));
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff960);
      __gnu_cxx::
      __normal_iterator<const_toml::basic_value<toml::type_config>_*,_std::vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>_>
      ::operator++(&local_4b0);
    }
    bVar1 = std::
            vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
            ::empty((vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
                     *)in_stack_fffffffffffff970);
    if (!bVar1) {
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::pop_back
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff960);
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::pop_back
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff960);
    }
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff960,in_stack_fffffffffffff95f);
    *(undefined1 *)(in_RSI + 0x18) = 0;
  }
  else {
    std::__cxx11::string::string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff970);
    string_conv<std::__cxx11::string,3ul>
              ((char (*) [3])CONCAT17(in_stack_fffffffffffff95f,in_stack_fffffffffffff958));
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff960,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffff95f,in_stack_fffffffffffff958));
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff960);
    std::
    vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
    ::begin((vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
             *)CONCAT17(in_stack_fffffffffffff95f,in_stack_fffffffffffff958));
    std::
    vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
    ::end((vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
           *)CONCAT17(in_stack_fffffffffffff95f,in_stack_fffffffffffff958));
    while (bVar1 = __gnu_cxx::
                   operator==<const_toml::basic_value<toml::type_config>_*,_std::vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>_>
                             ((__normal_iterator<const_toml::basic_value<toml::type_config>_*,_std::vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>_>
                               *)in_stack_fffffffffffff960,
                              (__normal_iterator<const_toml::basic_value<toml::type_config>_*,_std::vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>_>
                               *)CONCAT17(in_stack_fffffffffffff95f,in_stack_fffffffffffff958)),
          ((bVar1 ^ 0xffU) & 1) != 0) {
      this_01 = __gnu_cxx::
                __normal_iterator<const_toml::basic_value<toml::type_config>_*,_std::vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>_>
                ::operator*((__normal_iterator<const_toml::basic_value<toml::type_config>_*,_std::vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>_>
                             *)&stack0xfffffffffffffac8);
      *(int *)(in_RSI + 0x1c) = *(int *)(in_RSI + 0x1c) + *(int *)(local_20 + 4);
      basic_value<toml::type_config>::comments(this_01);
      format_comments_abi_cxx11_
                (this_02,(preserve_comments *)in_RDI,
                 (indent_char)((ulong)in_stack_fffffffffffff9f8 >> 0x38));
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      operator+=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff960,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffff95f,in_stack_fffffffffffff958));
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff960);
      format_indent_abi_cxx11_
                ((serializer<toml::type_config> *)in_stack_fffffffffffff9d8,
                 (indent_char)((ulong)in_stack_fffffffffffff9d0 >> 0x38));
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      operator+=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff960,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffff95f,in_stack_fffffffffffff958));
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff960);
      *(int *)(in_RSI + 0x1c) = *(int *)(in_RSI + 0x1c) - *(int *)(local_20 + 4);
      *(undefined1 *)(in_RSI + 0x18) = 1;
      operator()[abi_cxx11_(in_stack_00000118,in_stack_00000110);
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      operator+=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff960,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffff95f,in_stack_fffffffffffff958));
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff960);
      string_conv<std::__cxx11::string,3ul>
                ((char (*) [3])CONCAT17(in_stack_fffffffffffff95f,in_stack_fffffffffffff958));
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      operator+=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff960,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffff95f,in_stack_fffffffffffff958));
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff960);
      __gnu_cxx::
      __normal_iterator<const_toml::basic_value<toml::type_config>_*,_std::vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>_>
      ::operator++((__normal_iterator<const_toml::basic_value<toml::type_config>_*,_std::vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>_>
                    *)&stack0xfffffffffffffac8);
    }
    *(undefined1 *)(in_RSI + 0x18) = 0;
    *(int *)(in_RSI + 0x1c) = *(int *)(in_RSI + 0x1c) + *(int *)(local_20 + 8);
    format_indent_abi_cxx11_
              ((serializer<toml::type_config> *)in_stack_fffffffffffff9d8,
               (indent_char)((ulong)in_stack_fffffffffffff9d0 >> 0x38));
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff960,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffff95f,in_stack_fffffffffffff958));
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff960);
    *(int *)(in_RSI + 0x1c) = *(int *)(in_RSI + 0x1c) - *(int *)(local_20 + 8);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff960,in_stack_fffffffffffff95f);
  }
  return (string_type *)this_02;
}

Assistant:

string_type operator()(const array_type& a, const array_format_info& fmt, const comment_type& com, const source_location& loc) // {{{
    {
        array_format f = fmt.fmt;
        if(fmt.fmt == array_format::default_format)
        {
            // [[in.this.form]], you cannot add a comment to the array itself
            // (but you can add a comment to each table).
            // To keep comments, we need to avoid multiline array-of-tables
            // if array itself has a comment.
            if( ! this->keys_.empty() &&
                ! a.empty() &&
                com.empty() &&
                std::all_of(a.begin(), a.end(), [](const value_type& e) {return e.is_table();}))
            {
                f = array_format::array_of_tables;
            }
            else
            {
                f = array_format::oneline;

                // check if it becomes long
                std::size_t approx_len = 0;
                for(const auto& e : a)
                {
                    // have a comment. cannot be inlined
                    if( ! e.comments().empty())
                    {
                        f = array_format::multiline;
                        break;
                    }
                    // possibly long types ...
                    if(e.is_array() || e.is_table() || e.is_offset_datetime() || e.is_local_datetime())
                    {
                        f = array_format::multiline;
                        break;
                    }
                    else if(e.is_boolean())
                    {
                        approx_len += (*this)(e.as_boolean(), e.as_boolean_fmt(), e.location()).size();
                    }
                    else if(e.is_integer())
                    {
                        approx_len += (*this)(e.as_integer(), e.as_integer_fmt(), e.location()).size();
                    }
                    else if(e.is_floating())
                    {
                        approx_len += (*this)(e.as_floating(), e.as_floating_fmt(), e.location()).size();
                    }
                    else if(e.is_string())
                    {
                        if(e.as_string_fmt().fmt == string_format::multiline_basic ||
                           e.as_string_fmt().fmt == string_format::multiline_literal)
                        {
                            f = array_format::multiline;
                            break;
                        }
                        approx_len += 2 + (*this)(e.as_string(), e.as_string_fmt(), e.location()).size();
                    }
                    else if(e.is_local_date())
                    {
                        approx_len += 10; // 1234-56-78
                    }
                    else if(e.is_local_time())
                    {
                        approx_len += 15; // 12:34:56.789012
                    }

                    if(approx_len > 60) // key, ` = `, `[...]` < 80
                    {
                        f = array_format::multiline;
                        break;
                    }
                    approx_len += 2; // `, `
                }
            }
        }
        if(this->force_inline_ && f == array_format::array_of_tables)
        {
            f = array_format::multiline;
        }
        if(a.empty() && f == array_format::array_of_tables)
        {
            f = array_format::oneline;
        }

        // --------------------------------------------------------------------

        if(f == array_format::array_of_tables)
        {
            if(this->keys_.empty())
            {
                throw serialization_error("array of table must have its key. "
                        "use format(key, v)", loc);
            }
            string_type retval;
            for(const auto& e : a)
            {
                assert(e.is_table());

                this->current_indent_ += e.as_table_fmt().name_indent;
                retval += this->format_comments(e.comments(), e.as_table_fmt().indent_type);
                retval += this->format_indent(e.as_table_fmt().indent_type);
                this->current_indent_ -= e.as_table_fmt().name_indent;

                retval += string_conv<string_type>("[[");
                retval += this->format_keys(this->keys_).value();
                retval += string_conv<string_type>("]]\n");

                retval += this->format_ml_table(e.as_table(), e.as_table_fmt());
            }
            return retval;
        }
        else if(f == array_format::oneline)
        {
            // ignore comments. we cannot emit comments
            string_type retval;
            retval += char_type('[');
            for(const auto& e : a)
            {
                this->force_inline_ = true;
                retval += (*this)(e);
                retval += string_conv<string_type>(", ");
            }
            if( ! a.empty())
            {
                retval.pop_back(); // ` `
                retval.pop_back(); // `,`
            }
            retval += char_type(']');
            this->force_inline_ = false;
            return retval;
        }
        else
        {
            assert(f == array_format::multiline);

            string_type retval;
            retval += string_conv<string_type>("[\n");

            for(const auto& e : a)
            {
                this->current_indent_ += fmt.body_indent;
                retval += this->format_comments(e.comments(), fmt.indent_type);
                retval += this->format_indent(fmt.indent_type);
                this->current_indent_ -= fmt.body_indent;

                this->force_inline_ = true;
                retval += (*this)(e);
                retval += string_conv<string_type>(",\n");
            }
            this->force_inline_ = false;

            this->current_indent_ += fmt.closing_indent;
            retval += this->format_indent(fmt.indent_type);
            this->current_indent_ -= fmt.closing_indent;

            retval += char_type(']');
            return retval;
        }
    }